

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::checkTypeSupportedForExternalEvents(Context *context,Type *t)

{
  Type *pTVar1;
  bool bVar2;
  Structure *this;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *this_00;
  Member *pMVar3;
  char (*args) [36];
  Member *m;
  Member *__end3;
  Member *__begin3;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *__range3;
  CompileMessage local_50;
  Type *local_18;
  Type *t_local;
  Context *context_local;
  
  local_18 = t;
  t_local = (Type *)context;
  bVar2 = Type::isBoundedInt(t);
  pTVar1 = t_local;
  if (bVar2) {
    Errors::notYetImplemented<char_const(&)[36]>
              (&local_50,(Errors *)"Endpoints using wrap or clamp types",args);
    AST::Context::throwError((Context *)pTVar1,&local_50,false);
  }
  bVar2 = Type::isArray(local_18);
  pTVar1 = t_local;
  if (bVar2) {
    Type::getArrayElementType((Type *)&__range3,local_18);
    checkTypeSupportedForExternalEvents((Context *)pTVar1,(Type *)&__range3);
    Type::~Type((Type *)&__range3);
  }
  bVar2 = Type::isStruct(local_18);
  if (bVar2) {
    this = Type::getStructRef(local_18);
    this_00 = Structure::getMembers(this);
    __end3 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::begin(this_00);
    pMVar3 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::end(this_00);
    for (; __end3 != pMVar3; __end3 = __end3 + 1) {
      checkTypeSupportedForExternalEvents((Context *)t_local,&__end3->type);
    }
  }
  return;
}

Assistant:

static void checkTypeSupportedForExternalEvents (const AST::Context& context, const Type& t)
    {
        if (t.isBoundedInt())
            context.throwError (Errors::notYetImplemented ("Endpoints using wrap or clamp types"));

        if (t.isArray())
            checkTypeSupportedForExternalEvents (context, t.getArrayElementType());

        if (t.isStruct())
            for (auto& m : t.getStructRef().getMembers())
                checkTypeSupportedForExternalEvents (context, m.type);
    }